

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O3

void __thiscall
qclab::dense::SquareMatrix<float>::SquareMatrix(SquareMatrix<float> *this,int64_t size)

{
  float *pfVar1;
  ulong uVar2;
  
  this->size_ = size;
  if (size == 0) {
    __assert_fail("size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/memory.hpp"
                  ,0x12,"auto qclab::dense::alloc_unique_array(const int64_t) [T = float]");
  }
  uVar2 = 0xffffffffffffffff;
  if ((ulong)(size * size) >> 0x3e == 0) {
    uVar2 = size * size * 4;
  }
  pfVar1 = (float *)operator_new__(uVar2);
  (this->data_)._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
  super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
  super__Head_base<0UL,_float_*,_false>._M_head_impl = pfVar1;
  if (0 < size) {
    return;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/dense/SquareMatrix.hpp"
                ,0x2d,"qclab::dense::SquareMatrix<float>::SquareMatrix(const int64_t) [T = float]");
}

Assistant:

SquareMatrix( const int64_t size )
        : size_( size )
        , data_( alloc_unique_array< T >( size * size ) )
        {
          assert( size > 0 ) ;
        }